

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linker.cpp
# Opt level: O1

void __thiscall Linker::CleanCode(Linker *this)

{
  StackChunk *pSVar1;
  Node **__s;
  uint uVar2;
  ulong uVar3;
  
  (this->exTypes).count = 0;
  (this->exTypeExtra).count = 0;
  (this->exTypeConstants).count = 0;
  (this->exVariables).count = 0;
  (this->exFunctions).count = 0;
  (this->exFunctionExplicitTypeArrayOffsets).count = 0;
  (this->exFunctionExplicitTypes).count = 0;
  (this->exSymbols).count = 0;
  (this->exLocals).count = 0;
  (this->exModules).count = 0;
  (this->exSource).count = 0;
  (this->exImportPaths).count = 0;
  (this->exMainModuleName).count = 0;
  (this->exRegVmCode).count = 0;
  (this->exRegVmSourceInfo).count = 0;
  (this->exRegVmConstants).count = 0;
  (this->exRegVmRegKillInfo).count = 0;
  memset(&(this->exRegVmExecCount).count,0,0x404);
  if ((this->expiredRegVmCode).count != 0) {
    uVar3 = 0;
    do {
      (*(code *)NULLC::dealloc)((this->expiredRegVmCode).data[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->expiredRegVmCode).count);
  }
  (this->expiredRegVmCode).count = 0;
  if ((this->expiredRegVmConstants).count != 0) {
    uVar3 = 0;
    do {
      (*(code *)NULLC::dealloc)((this->expiredRegVmConstants).data[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->expiredRegVmConstants).count);
  }
  *(undefined8 *)&(this->expiredRegVmConstants).count = 0;
  (this->regVmJumpTargets).count = 0;
  (this->typeRemap).count = 0;
  (this->funcRemap).count = 0;
  (this->moduleRemap).count = 0;
  pSVar1 = (this->funcMap).nodePool.first;
  __s = (this->funcMap).entries;
  (this->funcMap).nodePool.curr = pSVar1;
  uVar2 = 0xffc;
  if (pSVar1 != (StackChunk *)0x0) {
    uVar2 = 0;
  }
  (this->funcMap).nodePool.size = uVar2;
  memset(__s,0,0x2000);
  this->debugOutputIndent = 0;
  NULLC::ClearMemory();
  return;
}

Assistant:

void Linker::CleanCode()
{
	exTypes.clear();
	exTypeExtra.clear();
	exTypeConstants.clear();
	exVariables.clear();
	exFunctions.clear();
	exFunctionExplicitTypeArrayOffsets.clear();
	exFunctionExplicitTypes.clear();
	exSymbols.clear();
	exLocals.clear();
	exModules.clear();
	exSource.clear();
	exImportPaths.clear();
	exMainModuleName.clear();

	exRegVmCode.clear();
	exRegVmSourceInfo.clear();
	exRegVmExecCount.clear();
	exRegVmConstants.clear();
	exRegVmRegKillInfo.clear();
	memset(exRegVmInstructionExecCount.data, 0, sizeof(exRegVmInstructionExecCount));

	for(unsigned i = 0; i < expiredRegVmCode.size(); i++)
		NULLC::dealloc(expiredRegVmCode[i]);
	expiredRegVmCode.clear();

	for(unsigned i = 0; i < expiredRegVmConstants.size(); i++)
		NULLC::dealloc(expiredRegVmConstants[i]);
	expiredRegVmConstants.clear();

#ifdef NULLC_LLVM_SUPPORT
	llvmModuleSizes.clear();
	llvmModuleCodes.clear();

	llvmTypeRemapSizes.clear();
	llvmTypeRemapOffsets.clear();
	llvmTypeRemapValues.clear();

	llvmFuncRemapSizes.clear();
	llvmFuncRemapOffsets.clear();
	llvmFuncRemapValues.clear();
#endif

	regVmJumpTargets.clear();

	globalVarSize = 0;

	typeRemap.clear();
	funcRemap.clear();
	moduleRemap.clear();

	funcMap.clear();

	debugOutputIndent = 0;

	NULLC::ClearMemory();
}